

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ethercatcoe.c
# Opt level: O3

int ecx_readPDOmap(ecx_contextt *context,uint16 Slave,int *Osize,int *Isize)

{
  uint *puVar1;
  uint8 uVar2;
  int iVar3;
  int *piVar4;
  uint uVar5;
  ulong uVar6;
  uint8 uVar7;
  char cVar8;
  char cVar9;
  long lVar10;
  uint8 tSM;
  byte local_4d;
  int rdl;
  long local_48;
  int *local_40;
  int *local_38;
  
  *Isize = 0;
  *Osize = 0;
  rdl = 1;
  local_4d = 0;
  local_40 = Osize;
  local_38 = Isize;
  iVar3 = ecx_SDOread(context,Slave,0x1c00,'\0','\0',&rdl,&local_4d,700000);
  if (2 < local_4d && 0 < iVar3) {
    local_48 = (ulong)Slave * 0x148;
    uVar6 = 8;
    if ((ulong)(byte)(local_4d - 1) < 8) {
      uVar6 = (ulong)(byte)(local_4d - 1);
    }
    lVar10 = 0;
    cVar8 = '\0';
    do {
      rdl = 1;
      tSM = '\0';
      iVar3 = ecx_SDOread(context,Slave,0x1c00,(char)lVar10 + '\x03','\0',&rdl,&tSM,700000);
      if (0 < iVar3) {
        cVar9 = cVar8;
        if (tSM == '\x02') {
          cVar9 = '\x01';
        }
        if (lVar10 != 0) {
          cVar9 = cVar8;
        }
        if (tSM == '\0') {
          uVar7 = '\0';
        }
        else {
          uVar7 = tSM + cVar9;
          tSM = uVar7;
        }
        cVar8 = cVar9;
        if (((lVar10 == 0) && (uVar2 = '\x03', uVar7 == '\0')) ||
           ((lVar10 == 1 && (uVar2 = '\x04', uVar7 == '\0')))) {
          uVar7 = uVar2;
          context->slavelist->SMtype[lVar10 + local_48 + 2] = uVar7;
          tSM = uVar7;
        }
        else {
          context->slavelist->SMtype[lVar10 + local_48 + 2] = uVar7;
          if (uVar7 == '\0') {
            puVar1 = (uint *)((long)&context->slavelist->SM[lVar10 + 2].SMflags + local_48);
            *puVar1 = *puVar1 & 0xfffeffff;
            goto LAB_00106912;
          }
        }
        if (((byte)(uVar7 - 3) < 2) &&
           (iVar3 = ecx_readPDOassign(context,Slave,(short)lVar10 + 0x1c12), iVar3 != 0)) {
          uVar5 = iVar3 + 0xe;
          if (-1 < (int)(iVar3 + 7U)) {
            uVar5 = iVar3 + 7U;
          }
          *(short *)((long)&context->slavelist->SM[lVar10 + 2].SMlength + local_48) =
               (short)(uVar5 >> 3);
          piVar4 = local_38;
          if (uVar7 == '\x03') {
            piVar4 = local_40;
          }
          *piVar4 = *piVar4 + iVar3;
        }
      }
LAB_00106912:
      lVar10 = lVar10 + 1;
    } while (uVar6 - 1 != lVar10);
  }
  if ((*local_38 < 1) && (*local_40 < 1)) {
    iVar3 = 0;
  }
  else {
    iVar3 = 1;
  }
  return iVar3;
}

Assistant:

int ecx_readPDOmap(ecx_contextt *context, uint16 Slave, int *Osize, int *Isize)
{
   int wkc, rdl;
   int retVal = 0;
   uint8 nSM, iSM, tSM;
   int Tsize;
   uint8 SMt_bug_add;
   
   *Isize = 0;
   *Osize = 0;
   SMt_bug_add = 0;
   rdl = sizeof(nSM); nSM = 0;
   /* read SyncManager Communication Type object count */
   wkc = ecx_SDOread(context, Slave, ECT_SDO_SMCOMMTYPE, 0x00, FALSE, &rdl, &nSM, EC_TIMEOUTRXM);
   /* positive result from slave ? */
   if ((wkc > 0) && (nSM > 2))
   {
      /* make nSM equal to number of defined SM */
      nSM--;
      /* limit to maximum number of SM defined, if true the slave can't be configured */
      if (nSM > EC_MAXSM)
         nSM = EC_MAXSM;
      /* iterate for every SM type defined */
      for (iSM = 2 ; iSM <= nSM ; iSM++)
      {
         rdl = sizeof(tSM); tSM = 0;
         /* read SyncManager Communication Type */
         wkc = ecx_SDOread(context, Slave, ECT_SDO_SMCOMMTYPE, iSM + 1, FALSE, &rdl, &tSM, EC_TIMEOUTRXM);
         if (wkc > 0)
         {
// start slave bug prevention code, remove if possible            
            if((iSM == 2) && (tSM == 2)) // SM2 has type 2 == mailbox out, this is a bug in the slave!
            {   
               SMt_bug_add = 1; // try to correct, this works if the types are 0 1 2 3 and should be 1 2 3 4
            }
            if(tSM)
            {   
               tSM += SMt_bug_add; // only add if SMt > 0
            }
            if((iSM == 2) && (tSM == 0)) // SM2 has type 0, this is a bug in the slave!
            {   
               tSM = 3;
            }
            if((iSM == 3) && (tSM == 0)) // SM3 has type 0, this is a bug in the slave!
            {   
               tSM = 4;
            }
// end slave bug prevention code            

            context->slavelist[Slave].SMtype[iSM] = tSM;
            /* check if SM is unused -> clear enable flag */
            if (tSM == 0)
            {
               context->slavelist[Slave].SM[iSM].SMflags = 
                  htoel( etohl(context->slavelist[Slave].SM[iSM].SMflags) & EC_SMENABLEMASK);
            }
            if ((tSM == 3) || (tSM == 4))
            {
               /* read the assign PDO */
               Tsize = ecx_readPDOassign(context, Slave, ECT_SDO_PDOASSIGN + iSM );
               /* if a mapping is found */
               if (Tsize)
               {
                  context->slavelist[Slave].SM[iSM].SMlength = htoes((Tsize + 7) / 8);
                  if (tSM == 3)
                  {  
                     /* we are doing outputs */
                     *Osize += Tsize;
                  }
                  else
                  {
                     /* we are doing inputs */
                     *Isize += Tsize;
                  }   
               }   
            }   
         }   
      }
   }

   /* found some I/O bits ? */
   if ((*Isize > 0) || (*Osize > 0))
   {
      retVal = 1;
   }
      
   return retVal;
}